

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O2

int64_t av1_haar_ac_sad_mxn_uint8_input
                  (uint8_t *input,int stride,int hbd,int num_8x8_rows,int num_8x8_cols)

{
  int iVar1;
  int r;
  long lVar2;
  ulong uVar3;
  tran_low_t *ptVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  tran_low_t output [64];
  tran_low_t local_138 [66];
  
  uVar7 = (ulong)(uint)num_8x8_cols;
  uVar6 = 0;
  if (num_8x8_cols < 1) {
    uVar7 = 0;
  }
  uVar3 = (ulong)(uint)num_8x8_rows;
  if (num_8x8_rows < 1) {
    uVar3 = 0;
  }
  lVar11 = 0;
  for (; uVar6 != uVar3; uVar6 = uVar6 + 1) {
    for (uVar8 = 0; uVar8 != uVar7; uVar8 = uVar8 + 1) {
      av1_fdwt8x8_uint8_input_c
                (input + uVar8 * 8 + (long)(stride * 8 * (int)uVar6),local_138,stride,hbd);
      uVar5 = 0;
      ptVar4 = local_138;
      for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
        for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
          if ((((uint)lVar9 | (uint)lVar2) & 0xfffffffc) != 0) {
            iVar1 = ptVar4[lVar9];
            iVar10 = -iVar1;
            if (0 < iVar1) {
              iVar10 = iVar1;
            }
            uVar5 = uVar5 + iVar10;
          }
        }
        ptVar4 = ptVar4 + 8;
      }
      lVar11 = lVar11 + (ulong)uVar5;
    }
  }
  return lVar11;
}

Assistant:

int64_t av1_haar_ac_sad_mxn_uint8_input(const uint8_t *input, int stride,
                                        int hbd, int num_8x8_rows,
                                        int num_8x8_cols) {
  int64_t wavelet_energy = 0;
  for (int r8 = 0; r8 < num_8x8_rows; ++r8) {
    for (int c8 = 0; c8 < num_8x8_cols; ++c8) {
      wavelet_energy += haar_ac_sad_8x8_uint8_input(
          input + c8 * 8 + r8 * 8 * stride, stride, hbd);
    }
  }
  return wavelet_energy;
}